

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::builtins::DumpVarsTask::bindArgument
          (DumpVarsTask *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *args)

{
  SymbolKind SVar1;
  Compilation *comp;
  InstanceSymbol *this_00;
  bool bVar2;
  uint uVar3;
  Diagnostic *pDVar4;
  Diagnostic *pDVar5;
  Expression *pEVar6;
  SourceRange sourceRange;
  Diagnostic *local_30;
  
  if (argIndex == 0) {
    pEVar6 = SystemSubroutine::bindArgument((SystemSubroutine *)this,0,context,syntax,args);
    return pEVar6;
  }
  comp = ((context->scope).ptr)->compilation;
  bVar2 = slang::syntax::NameSyntax::isKind((syntax->super_SyntaxNode).kind);
  if (bVar2) {
    pDVar4 = (Diagnostic *)
             ArbitrarySymbolExpression::fromSyntax
                       (comp,(NameSyntax *)syntax,context,(bitmask<slang::ast::LookupFlags>)0x0);
    if (((Expression *)&pDVar4->args)->kind == ArbitrarySymbol) {
      this_00 = (InstanceSymbol *)
                (pDVar4->notes).
                super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
                super__Vector_impl_data._M_start;
      SVar1 = (this_00->super_InstanceSymbolBase).super_Symbol.kind;
      if ((SVar1 - Net < 2) ||
         ((SVar1 == Instance && (bVar2 = InstanceSymbol::isModule(this_00), bVar2)))) {
        bVar2 = true;
        uVar3 = (this_00->super_InstanceSymbolBase).super_Symbol.kind - Variable;
        pDVar5 = (Diagnostic *)(ulong)uVar3;
        if ((uVar3 < 0x19) &&
           (((0x1800c0fU >> (uVar3 & 0x1f) & 1) != 0 && (*(int *)&this_00[2].body == 0)))) {
          pDVar5 = ASTContext::addDiag(context,(DiagCode)0x4000b,
                                       *(SourceRange *)
                                        &(pDVar4->ranges).
                                         super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                                         ._M_impl.super__Vector_impl_data._M_finish);
          pDVar5 = Diagnostic::operator<<
                             (pDVar5,(this_00->super_InstanceSymbolBase).super_Symbol.name);
        }
      }
      else {
        bVar2 = Scope::isUninstantiated((context->scope).ptr);
        if (!bVar2) {
          ASTContext::addDiag(context,(DiagCode)0x9000b,
                              *(SourceRange *)
                               &(pDVar4->ranges).
                                super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        local_30 = pDVar4;
        pDVar5 = (Diagnostic *)
                 BumpAllocator::
                 emplace<slang::ast::InvalidExpression,slang::ast::Expression*,slang::ast::Type_const&>
                           (&comp->super_BumpAllocator,(Expression **)&local_30,comp->errorType);
        bVar2 = false;
      }
      if (!bVar2) {
        return (Expression *)pDVar5;
      }
    }
  }
  else {
    sourceRange = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
    ASTContext::addDiag(context,(DiagCode)0x9000b,sourceRange);
    local_30 = (Diagnostic *)0x0;
    pDVar4 = (Diagnostic *)
             BumpAllocator::
             emplace<slang::ast::InvalidExpression,decltype(nullptr),slang::ast::Type_const&>
                       (&comp->super_BumpAllocator,&local_30,comp->errorType);
  }
  return (Expression *)pDVar4;
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if (argIndex > 0) {
            auto& comp = context.getCompilation();
            if (!NameSyntax::isKind(syntax.kind)) {
                context.addDiag(diag::ExpectedModOrVarName, syntax.sourceRange());
                return *comp.emplace<InvalidExpression>(nullptr, comp.getErrorType());
            }

            auto& ref = ArbitrarySymbolExpression::fromSyntax(comp, syntax.as<NameSyntax>(),
                                                              context);

            if (ref.kind == ExpressionKind::ArbitrarySymbol) {
                auto& sym = *ref.as<ArbitrarySymbolExpression>().symbol;
                if (sym.kind != SymbolKind::Variable && sym.kind != SymbolKind::Net &&
                    (sym.kind != SymbolKind::Instance || !sym.as<InstanceSymbol>().isModule())) {
                    if (!context.scope->isUninstantiated())
                        context.addDiag(diag::ExpectedModOrVarName, ref.sourceRange);
                    return *comp.emplace<InvalidExpression>(&ref, comp.getErrorType());
                }
                else if (VariableSymbol::isKind(sym.kind) &&
                         sym.as<VariableSymbol>().lifetime == VariableLifetime::Automatic) {
                    context.addDiag(diag::AutoVarTraced, ref.sourceRange) << sym.name;
                }
            }

            return ref;
        }

        return SystemTaskBase::bindArgument(argIndex, context, syntax, args);
    }